

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O2

CURLcode Curl_doh_is_resolved(Curl_easy *data,Curl_dns_entry **dnsp)

{
  undefined1 *puVar1;
  byte bVar2;
  DNStype DVar3;
  doh_probes *pdVar4;
  curl_trc_feat *pcVar5;
  sockaddr *psVar6;
  ushort uVar7;
  ushort uVar8;
  undefined8 uVar9;
  short sVar10;
  DOHcode DVar11;
  CURLcode CVar12;
  uchar *puVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  Curl_addrinfo *pCVar17;
  Curl_dns_entry *entry;
  sa_family_t sVar18;
  int iVar19;
  long lVar20;
  char *pcVar21;
  char *pcVar22;
  uint uVar23;
  anon_union_16_2_f9ece763_for_ip *paVar24;
  long lVar25;
  Curl_addrinfo *addr;
  ulong uVar26;
  uint uVar27;
  undefined8 *puVar28;
  dynbuf *pdVar29;
  uint *puVar30;
  DNStype DVar31;
  dohentry *s;
  size_t sVar32;
  ushort uVar33;
  Curl_addrinfo *pCVar34;
  bool bVar35;
  byte bVar36;
  DOHcode rc [2];
  uint local_328 [34];
  dohentry de;
  
  bVar36 = 0;
  pdVar4 = (data->state).async.doh;
  *dnsp = (Curl_dns_entry *)0x0;
  if (pdVar4 == (doh_probes *)0x0) {
    CVar12 = CURLE_OUT_OF_MEMORY;
  }
  else if ((pdVar4->probe_resp[0].probe_mid == 0xffffffff) &&
          (pdVar4->probe_resp[1].probe_mid == 0xffffffff)) {
    Curl_failf(data,"Could not DoH-resolve: %s",pdVar4->host);
    CVar12 = (((ulong)data->conn->bits & 0x10) == 0) + CURLE_COULDNT_RESOLVE_PROXY;
  }
  else {
    CVar12 = CURLE_OK;
    if (pdVar4->pending == 0) {
      Curl_resolv_unlink(data,&(data->state).async.dns);
      rc[0] = DOH_OK;
      rc[1] = DOH_OK;
      Curl_doh_close(data);
      memset(&de,0,0x270);
      de.ttl = 0x7fffffff;
      for (lVar25 = 0; lVar25 != 0x80; lVar25 = lVar25 + 0x20) {
        Curl_dyn_init((dynbuf *)((long)&de.cname[0].bufr + lVar25),0x100);
      }
      lVar25 = 0;
LAB_00123cfd:
      if (lVar25 != 2) {
        if (pdVar4->probe_resp[lVar25].dnstype != 0) {
          pdVar29 = &pdVar4->probe_resp[lVar25].body;
          puVar13 = Curl_dyn_uptr(pdVar29);
          sVar14 = Curl_dyn_len(pdVar29);
          DVar3 = pdVar4->probe_resp[lVar25].dnstype;
          local_328[0] = 0xc;
          DVar11 = DOH_TOO_SMALL_BUFFER;
          if ((((0xb < sVar14) && (DVar11 = DOH_DNS_BAD_ID, puVar13 != (uchar *)0x0)) &&
              (*puVar13 == '\0')) &&
             ((puVar13[1] == '\0' && (DVar11 = DOH_DNS_BAD_RCODE, (puVar13[3] & 0xf) == 0)))) {
            uVar33 = *(ushort *)(puVar13 + 4) << 8 | *(ushort *)(puVar13 + 4) >> 8;
            sVar32 = 0xc;
            uVar23 = local_328[0];
            do {
              local_328[0] = uVar23;
              bVar35 = uVar33 == 0;
              uVar33 = uVar33 - 1;
              if (bVar35) {
                uVar33 = *(ushort *)(puVar13 + 6) << 8 | *(ushort *)(puVar13 + 6) >> 8;
                DVar31 = 0;
                uVar23 = local_328[0];
                goto LAB_00123de1;
              }
              DVar11 = doh_skipqname(puVar13,sVar14,local_328);
              if (DVar11 != DOH_OK) goto LAB_00124195;
              sVar32 = (size_t)(local_328[0] + 4);
              uVar23 = local_328[0] + 4;
            } while (sVar32 <= sVar14);
            goto LAB_0012418d;
          }
          goto LAB_00124195;
        }
        goto LAB_0012420f;
      }
      if ((rc[0] == DOH_OK) || (rc[1] == DOH_OK)) {
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
           (((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)
             ) && (0 < Curl_trc_feat_dns.log_level)))) {
          Curl_trc_dns(data,"hostname: %s",pdVar4->host);
          if ((((data->set).field_0x89f & 0x40) != 0) &&
             ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
              (0 < pcVar5->log_level)))) {
            Curl_infof(data,"[DoH] TTL: %u seconds",(ulong)de.ttl);
          }
          puVar13 = de.addr[0].ip.v4 + 1;
          for (lVar25 = 0; s = &de, lVar25 < de.numaddr; lVar25 = lVar25 + 1) {
            iVar19 = de.addr[lVar25].type;
            if (iVar19 == 0x1c) {
              puVar28 = &DAT_00173680;
              puVar30 = local_328;
              for (lVar20 = 0x10; lVar20 != 0; lVar20 = lVar20 + -1) {
                *(undefined8 *)puVar30 = *puVar28;
                puVar28 = puVar28 + (ulong)bVar36 * -2 + 1;
                puVar30 = puVar30 + (ulong)bVar36 * -4 + 2;
              }
              sVar16 = strlen((char *)local_328);
              pcVar21 = (char *)((long)local_328 + sVar16);
              sVar14 = 0x80 - sVar16;
              for (uVar26 = 0; uVar26 < 0x10; uVar26 = uVar26 + 2) {
                pcVar22 = ":";
                if (uVar26 == 0) {
                  pcVar22 = "";
                }
                curl_msnprintf(pcVar21,sVar14,"%s%02x%02x",pcVar22,(ulong)puVar13[uVar26 - 1]);
                sVar16 = strlen(pcVar21);
                sVar14 = sVar14 - sVar16;
                pcVar21 = pcVar21 + sVar16;
              }
              if ((((data->set).field_0x89f & 0x40) != 0) &&
                 ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar5->log_level)))) {
                Curl_infof(data,"%s",local_328);
              }
            }
            else if (((iVar19 == 1) && (((data->set).field_0x89f & 0x40) != 0)) &&
                    ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                     (0 < pcVar5->log_level)))) {
              Curl_infof(data,"[DoH] A: %u.%u.%u.%u",(ulong)de.addr[lVar25].ip.v4[0],
                         (ulong)de.addr[lVar25].ip.v4[1],(ulong)de.addr[lVar25].ip.v4[2]);
            }
            puVar13 = puVar13 + 0x14;
          }
          for (lVar25 = 0; lVar25 < de.numcname; lVar25 = lVar25 + 1) {
            if ((((data->set).field_0x89f & 0x40) != 0) &&
               ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                (0 < pcVar5->log_level)))) {
              pcVar21 = Curl_dyn_ptr(s->cname);
              Curl_infof(data,"CNAME: %s",pcVar21);
            }
            s = (dohentry *)(s->cname + 1);
          }
        }
        pcVar21 = pdVar4->host;
        sVar16 = strlen(pcVar21);
        if (de.numaddr == 0) {
          CVar12 = CURLE_COULDNT_RESOLVE_HOST;
LAB_001246bd:
          de_cleanup(&de);
          return CVar12;
        }
        uVar33 = (ushort)pdVar4->port;
        paVar24 = &de.addr[0].ip;
        addr = (Curl_addrinfo *)0x0;
        pCVar34 = (Curl_addrinfo *)0x0;
        for (lVar25 = 0; lVar25 < de.numaddr; lVar25 = lVar25 + 1) {
          iVar19 = ((dohaddr *)((long)paVar24 + -4))->type;
          lVar20 = 0x1c;
          if (iVar19 != 0x1c) {
            lVar20 = 0x10;
          }
          pCVar17 = (Curl_addrinfo *)(*Curl_ccalloc)(1,sVar16 + 0x31 + lVar20);
          if (pCVar17 == (Curl_addrinfo *)0x0) {
            Curl_freeaddrinfo(addr);
            CVar12 = CURLE_OUT_OF_MEMORY;
            goto LAB_001246bd;
          }
          pCVar17->ai_addr = (sockaddr *)(pCVar17 + 1);
          pcVar22 = (char *)((long)&pCVar17[1].ai_flags + lVar20);
          pCVar17->ai_canonname = pcVar22;
          memcpy(pcVar22,pcVar21,sVar16 + 1);
          if (addr == (Curl_addrinfo *)0x0) {
            addr = pCVar17;
          }
          if (pCVar34 != (Curl_addrinfo *)0x0) {
            pCVar34->ai_next = pCVar17;
          }
          pCVar17->ai_family = (uint)(iVar19 == 0x1c) * 8 + 2;
          pCVar17->ai_socktype = 1;
          pCVar17->ai_addrlen = (curl_socklen_t)lVar20;
          psVar6 = pCVar17->ai_addr;
          if (iVar19 == 0x1c) {
            uVar9 = *(undefined8 *)((long)paVar24 + 8);
            *(undefined8 *)(psVar6->sa_data + 6) = *(undefined8 *)paVar24;
            psVar6[1].sa_family = (short)uVar9;
            psVar6[1].sa_data[0] = (char)((ulong)uVar9 >> 0x10);
            psVar6[1].sa_data[1] = (char)((ulong)uVar9 >> 0x18);
            psVar6[1].sa_data[2] = (char)((ulong)uVar9 >> 0x20);
            psVar6[1].sa_data[3] = (char)((ulong)uVar9 >> 0x28);
            psVar6[1].sa_data[4] = (char)((ulong)uVar9 >> 0x30);
            psVar6[1].sa_data[5] = (char)((ulong)uVar9 >> 0x38);
            sVar18 = 10;
          }
          else {
            *(undefined4 *)(psVar6->sa_data + 2) = *(undefined4 *)paVar24;
            sVar18 = 2;
          }
          psVar6->sa_family = sVar18;
          *(ushort *)psVar6->sa_data = uVar33 << 8 | uVar33 >> 8;
          paVar24 = (anon_union_16_2_f9ece763_for_ip *)((long)paVar24 + 0x14);
          pCVar34 = pCVar17;
        }
        CVar12 = CURLE_OK;
        entry = Curl_dnscache_mk_entry(data,addr,pdVar4->host,0,pdVar4->port,false);
        if (entry != (Curl_dns_entry *)0x0) {
          (data->state).async.dns = entry;
          CVar12 = Curl_dnscache_add(data,entry);
          *dnsp = (data->state).async.dns;
        }
      }
      else {
        CVar12 = CURLE_COULDNT_RESOLVE_HOST;
      }
      puVar1 = &(data->state).async.field_0x28;
      *puVar1 = *puVar1 | 1;
      de_cleanup(&de);
      Curl_doh_cleanup(data);
    }
  }
  return CVar12;
LAB_00123de1:
  do {
    local_328[0] = uVar23;
    bVar35 = uVar33 == 0;
    uVar33 = uVar33 - 1;
    if (bVar35) {
      uVar33 = *(ushort *)(puVar13 + 8) << 8 | *(ushort *)(puVar13 + 8) >> 8;
      uVar23 = local_328[0];
      goto LAB_001240a8;
    }
    DVar11 = doh_skipqname(puVar13,sVar14,local_328);
    if (DVar11 != DOH_OK) goto LAB_00124195;
    if (sVar14 < local_328[0] + 2) {
LAB_00124090:
      DVar11 = DOH_DNS_OUT_OF_RANGE;
      goto LAB_00124195;
    }
    uVar7 = CONCAT11(puVar13[local_328[0]],puVar13[local_328[0] + 1]);
    DVar31 = (DNStype)uVar7;
    if (((DVar31 != DNS_TYPE_CNAME) && (DVar31 != DNS_TYPE_DNAME)) && (DVar3 != DVar31)) {
      DVar11 = DOH_DNS_UNEXPECTED_TYPE;
      goto LAB_00124195;
    }
    if (sVar14 < local_328[0] + 4) goto LAB_00124090;
    if (CONCAT11(puVar13[local_328[0] + 2],puVar13[local_328[0] + 3]) != 1) {
      DVar11 = DOH_DNS_UNEXPECTED_CLASS;
      goto LAB_00124195;
    }
    if (sVar14 < local_328[0] + 8) goto LAB_00124090;
    uVar23 = *(uint *)(puVar13 + (local_328[0] + 4));
    uVar23 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 | uVar23 << 0x18;
    if (uVar23 < de.ttl) {
      de.ttl = uVar23;
    }
    uVar27 = local_328[0] + 10;
    uVar26 = (ulong)uVar27;
    if (sVar14 < uVar26) goto LAB_00124090;
    uVar8 = CONCAT11(puVar13[local_328[0] + 8],puVar13[local_328[0] + 9]);
    uVar23 = uVar27 + uVar8;
    sVar32 = (size_t)uVar23;
    if (sVar14 < sVar32) goto LAB_00124090;
    if (uVar7 == 0x1c) {
      if (uVar8 != 0x10) {
LAB_0012411a:
        DVar11 = DOH_DNS_RDATA_LEN;
        goto LAB_00124195;
      }
      lVar20 = (long)de.numaddr;
      if (lVar20 < 0x18) {
        de.addr[lVar20].type = 0x1c;
        uVar9 = *(undefined8 *)(puVar13 + (int)uVar27 + 8);
        *(undefined8 *)&de.addr[lVar20].ip = *(undefined8 *)(puVar13 + (int)uVar27);
        *(undefined8 *)((long)&de.addr[lVar20].ip + 8) = uVar9;
LAB_00124078:
        de.numaddr = de.numaddr + 1;
      }
      goto LAB_00123de1;
    }
    sVar10 = CONCAT11(puVar13[local_328[0]],puVar13[local_328[0] + 1]);
    if (sVar10 != 5) {
      if (sVar10 == 1) {
        if (uVar8 != 4) goto LAB_0012411a;
        lVar20 = (long)de.numaddr;
        if (lVar20 < 0x18) {
          de.addr[lVar20].type = 1;
          *(undefined4 *)&de.addr[lVar20].ip = *(undefined4 *)(puVar13 + (int)uVar27);
          goto LAB_00124078;
        }
      }
      goto LAB_00123de1;
    }
    lVar20 = (long)de.numcname;
    if (lVar20 == 4) goto LAB_00123de1;
    de.numcname = de.numcname + 1;
    pdVar29 = de.cname + lVar20;
    iVar19 = -0x7f;
    do {
      if (sVar14 <= uVar26) goto LAB_0012418d;
      bVar2 = puVar13[uVar26];
      if ((bVar2 & 0xc0) == 0) {
        uVar27 = (int)uVar26 + 1;
        if ((ulong)bVar2 != 0) {
          sVar15 = Curl_dyn_len(pdVar29);
          if ((sVar15 == 0) || (CVar12 = Curl_dyn_addn(pdVar29,".",1), CVar12 == CURLE_OK)) {
            uVar26 = (ulong)(bVar2 + uVar27);
            if (sVar14 < uVar26) goto LAB_00124112;
            CVar12 = Curl_dyn_addn(pdVar29,puVar13 + uVar27,(ulong)bVar2);
            if (CVar12 == CURLE_OK) goto LAB_00124024;
          }
          DVar11 = DOH_OUT_OF_MEM;
          goto LAB_00124195;
        }
        uVar26 = (ulong)uVar27;
      }
      else {
        if ((bVar2 & 0xc0) != 0xc0) {
LAB_00124112:
          DVar11 = DOH_DNS_BAD_LABEL;
          goto LAB_00124195;
        }
        uVar26 = (ulong)((int)uVar26 + 1);
        if (sVar14 <= uVar26) goto LAB_0012418d;
        uVar26 = (ulong)((uint)puVar13[uVar26] | (bVar2 & 0x3f) << 8);
      }
LAB_00124024:
    } while ((bVar2 != 0) && (bVar35 = iVar19 != 0, iVar19 = iVar19 + 1, bVar35));
  } while (bVar2 == 0);
  DVar11 = DOH_DNS_LABEL_LOOP;
  goto LAB_00124195;
  while( true ) {
    uVar23 = (uint)CONCAT11(puVar13[local_328[0] + 8],puVar13[local_328[0] + 9]) + local_328[0] + 10
    ;
    sVar32 = (size_t)uVar23;
    if (sVar14 < sVar32) break;
LAB_001240a8:
    local_328[0] = uVar23;
    bVar35 = uVar33 == 0;
    uVar33 = uVar33 - 1;
    if (bVar35) {
      uVar33 = *(ushort *)(puVar13 + 10) << 8 | *(ushort *)(puVar13 + 10) >> 8;
      uVar23 = local_328[0];
      goto LAB_00124133;
    }
    DVar11 = doh_skipqname(puVar13,sVar14,local_328);
    if (DVar11 != DOH_OK) goto LAB_00124195;
    if ((sVar14 < local_328[0] + 8) || (sVar14 < local_328[0] + 10)) break;
  }
  goto LAB_0012418d;
  while( true ) {
    uVar23 = (uint)CONCAT11(puVar13[local_328[0] + 8],puVar13[local_328[0] + 9]) + local_328[0] + 10
    ;
    sVar32 = (size_t)uVar23;
    if (sVar14 < sVar32) break;
LAB_00124133:
    local_328[0] = uVar23;
    bVar35 = uVar33 == 0;
    uVar33 = uVar33 - 1;
    if (bVar35) {
      DVar11 = DOH_DNS_MALFORMAT;
      if (sVar14 == sVar32) {
        DVar11 = DOH_OK;
        if (de.numaddr == 0 && de.numcname == 0) {
          DVar11 = DOH_NO_CONTENT;
        }
        if ((short)DVar31 == 2) {
          DVar11 = DOH_OK;
        }
      }
      goto LAB_00124195;
    }
    DVar11 = doh_skipqname(puVar13,sVar14,local_328);
    if (DVar11 != DOH_OK) goto LAB_00124195;
    if ((sVar14 < local_328[0] + 8) || (sVar14 < local_328[0] + 10)) break;
  }
LAB_0012418d:
  DVar11 = DOH_DNS_OUT_OF_RANGE;
LAB_00124195:
  rc[lVar25] = DVar11;
  if ((((data != (Curl_easy *)0x0) && (DVar11 != DOH_OK)) && (((data->set).field_0x89f & 0x40) != 0)
      ) && ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))
           )) {
    DVar3 = pdVar4->probe_resp[lVar25].dnstype;
    pcVar21 = "unknown";
    if (DVar3 == DNS_TYPE_AAAA) {
      pcVar21 = "AAAA";
    }
    if (DVar3 == DNS_TYPE_A) {
      pcVar21 = "A";
    }
    Curl_infof(data,"DoH: %s type %s for %s",(long)&errors_rel + (long)(int)(&errors_rel)[DVar11],
               pcVar21);
  }
LAB_0012420f:
  lVar25 = lVar25 + 1;
  goto LAB_00123cfd;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct Curl_easy *data,
                              struct Curl_dns_entry **dnsp)
{
  CURLcode result;
  struct doh_probes *dohp = data->state.async.doh;
  *dnsp = NULL; /* defaults to no response */
  if(!dohp)
    return CURLE_OUT_OF_MEMORY;

  if(dohp->probe_resp[DOH_SLOT_IPV4].probe_mid == UINT_MAX &&
     dohp->probe_resp[DOH_SLOT_IPV6].probe_mid == UINT_MAX) {
    failf(data, "Could not DoH-resolve: %s", dohp->host);
    return CONN_IS_PROXIED(data->conn) ? CURLE_COULDNT_RESOLVE_PROXY :
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!dohp->pending) {
    DOHcode rc[DOH_SLOT_COUNT];
    struct dohentry de;
    int slot;

    /* Clear any result the might still be there */
    Curl_resolv_unlink(data, &data->state.async.dns);

    memset(rc, 0, sizeof(rc));
    /* remove DoH handles from multi handle and close them */
    Curl_doh_close(data);
    /* parse the responses, create the struct and return it! */
    de_init(&de);
    for(slot = 0; slot < DOH_SLOT_COUNT; slot++) {
      struct doh_response *p = &dohp->probe_resp[slot];
      if(!p->dnstype)
        continue;
      rc[slot] = doh_resp_decode(Curl_dyn_uptr(&p->body),
                                 Curl_dyn_len(&p->body),
                                 p->dnstype, &de);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      if(rc[slot]) {
        infof(data, "DoH: %s type %s for %s", doh_strerror(rc[slot]),
              doh_type2name(p->dnstype), dohp->host);
      }
#endif
    } /* next slot */

    result = CURLE_COULDNT_RESOLVE_HOST; /* until we know better */
    if(!rc[DOH_SLOT_IPV4] || !rc[DOH_SLOT_IPV6]) {
      /* we have an address, of one kind or other */
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;


      if(Curl_trc_ft_is_verbose(data, &Curl_trc_feat_dns)) {
        CURL_TRC_DNS(data, "hostname: %s", dohp->host);
        doh_show(data, &de);
      }

      result = doh2ai(&de, dohp->host, dohp->port, &ai);
      if(result) {
        de_cleanup(&de);
        return result;
      }

      /* we got a response, create a dns entry. */
      dns = Curl_dnscache_mk_entry(data, ai, dohp->host, 0, dohp->port, FALSE);
      if(dns) {
        /* Now add and HTTPSRR information if we have */
#ifdef USE_HTTPSRR
        if(de.numhttps_rrs > 0 && result == CURLE_OK) {
          struct Curl_https_rrinfo *hrr = NULL;
          result = doh_resp_decode_httpsrr(data, de.https_rrs->val,
                                           de.https_rrs->len, &hrr);
          if(result) {
            infof(data, "Failed to decode HTTPS RR");
            return result;
          }
          infof(data, "Some HTTPS RR to process");
# ifdef DEBUGBUILD
          doh_print_httpsrr(data, hrr);
# endif
          dns->hinfo = hrr;
       }
#endif
        /* and add the entry to the cache */
        data->state.async.dns = dns;
        result = Curl_dnscache_add(data, dns);
        *dnsp = data->state.async.dns;
      }
    } /* address processing done */

    /* All done */
    data->state.async.done = TRUE;
    de_cleanup(&de);
    Curl_doh_cleanup(data);
    return result;

  } /* !dohp->pending */

  /* else wait for pending DoH transactions to complete */
  return CURLE_OK;
}